

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::path::
path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
          (path *this,string_view *source,format fmt)

{
  basic_string_view<char,_std::char_traits<char>_> *__t;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  format local_1c;
  string_view *psStack_18;
  format fmt_local;
  string_view *source_local;
  path *this_local;
  
  local_1c = fmt;
  psStack_18 = source;
  source_local = (string_view *)this;
  std::__cxx11::string::string((string *)this);
  __t = psStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,__t,&local_61);
  detail::toUtf8<char,_std::char_traits<char>,_std::allocator<char>,_1>(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  postprocess_path_with_format(&this->_path,local_1c);
  return;
}

Assistant:

inline path::path(const std::string_view& source, format fmt)
{
    _path = detail::toUtf8(std::string(source));
    postprocess_path_with_format(_path, fmt);
}